

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TgTypeParser.cpp
# Opt level: O2

Ptr __thiscall
TgBot::TgTypeParser::parseJsonAndGetInputMessageContent(TgTypeParser *this,ptree *data)

{
  basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Ptr PVar1;
  allocator local_c9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  type_conflict3 local_74;
  string tPnoneNumber;
  string tTitle;
  string tMessageText;
  
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&local_a8,"message_text",0x2e);
  std::__cxx11::string::string((string *)&tTitle,"",(allocator *)&tPnoneNumber);
  boost::property_tree::
  basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>::
  get<std::__cxx11::string>
            (&tMessageText,
             (basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
              *)in_RDX,&local_a8,&tTitle);
  std::__cxx11::string::~string((string *)&tTitle);
  std::__cxx11::string::~string((string *)&local_a8);
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&local_a8,"latitude",0x2e);
  tTitle._M_dataplus._M_p._0_4_ = 0x447a0000;
  local_74 = boost::property_tree::
             basic_ptree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::get<float>(in_RDX,&local_a8,(float *)&tTitle);
  std::__cxx11::string::~string((string *)&local_a8);
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&local_a8,"title",0x2e);
  std::__cxx11::string::string((string *)&tPnoneNumber,"",(allocator *)&local_c8);
  boost::property_tree::
  basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>::
  get<std::__cxx11::string>
            (&tTitle,(basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
                      *)in_RDX,&local_a8,&tPnoneNumber);
  std::__cxx11::string::~string((string *)&tPnoneNumber);
  std::__cxx11::string::~string((string *)&local_a8);
  boost::property_tree::
  string_path<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::property_tree::id_translator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::string_path(&local_a8,"phone_number",0x2e);
  std::__cxx11::string::string((string *)&local_c8,"",&local_c9);
  boost::property_tree::
  basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>::
  get<std::__cxx11::string>
            (&tPnoneNumber,
             (basic_ptree<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>>
              *)in_RDX,&local_a8,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_a8);
  if (tMessageText._M_string_length == 0) {
    if (tTitle._M_string_length == 0) {
      if ((local_74 != 1000.0) || (NAN(local_74))) {
        parseJsonAndGetInputLocationMessageContent((TgTypeParser *)&local_c8,in_RDX);
        std::static_pointer_cast<TgBot::InputMessageContent,TgBot::InputLocationMessageContent>
                  ((shared_ptr<TgBot::InputLocationMessageContent> *)&local_a8);
      }
      else {
        if (tPnoneNumber._M_string_length == 0) goto LAB_001ee4b2;
        parseJsonAndGetInputContactMessageContent((TgTypeParser *)&local_c8,in_RDX);
        std::static_pointer_cast<TgBot::InputMessageContent,TgBot::InputContactMessageContent>
                  ((shared_ptr<TgBot::InputContactMessageContent> *)&local_a8);
      }
    }
    else {
      parseJsonAndGetInputVenueMessageContent((TgTypeParser *)&local_c8,in_RDX);
      std::static_pointer_cast<TgBot::InputMessageContent,TgBot::InputVenueMessageContent>
                ((shared_ptr<TgBot::InputVenueMessageContent> *)&local_a8);
    }
  }
  else {
    parseJsonAndGetInputTextMessageContent((TgTypeParser *)&local_c8,in_RDX);
    std::static_pointer_cast<TgBot::InputMessageContent,TgBot::InputTextMessageContent>
              ((shared_ptr<TgBot::InputTextMessageContent> *)&local_a8);
  }
  std::__shared_ptr<TgBot::InputMessageContent,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<TgBot::InputMessageContent,_(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<TgBot::InputMessageContent,_(__gnu_cxx::_Lock_policy)2> *)&local_a8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_a8.m_value._M_string_length);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_c8._M_string_length);
LAB_001ee4b2:
  std::__cxx11::string::~string((string *)&tPnoneNumber);
  std::__cxx11::string::~string((string *)&tTitle);
  std::__cxx11::string::~string((string *)&tMessageText);
  PVar1.super___shared_ptr<TgBot::InputMessageContent,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = extraout_RDX._M_pi;
  PVar1.super___shared_ptr<TgBot::InputMessageContent,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Ptr)PVar1.super___shared_ptr<TgBot::InputMessageContent,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

InputMessageContent::Ptr TgTypeParser::parseJsonAndGetInputMessageContent(const boost::property_tree::ptree& data) const {
    InputMessageContent::Ptr result;
    // define InputMessageContent type

    string tMessageText = data.get<string>("message_text", "");
    float tLatitude = data.get<float>("latitude", 1000); // latitude belong (-90,90)
    string tTitle = data.get<string>("title", "");
    string tPnoneNumber = data.get<string>("phone_number", "");

    if (!tMessageText.empty()) {
        result = static_pointer_cast<InputMessageContent>(parseJsonAndGetInputTextMessageContent(data));
    } else if (!tTitle.empty()) {
        result = static_pointer_cast<InputMessageContent>(parseJsonAndGetInputVenueMessageContent(data));
    } else if (tLatitude != 1000) {
        result = static_pointer_cast<InputMessageContent>(parseJsonAndGetInputLocationMessageContent(data));
    } else if (!tPnoneNumber.empty()) {
        result = static_pointer_cast<InputMessageContent>(parseJsonAndGetInputContactMessageContent(data));
    }

    return result;
}